

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

int archive_write_shar_finish_entry(archive_write *a)

{
  shar *shar_00;
  int iVar1;
  mode_t mVar2;
  char *pcVar3;
  char *str;
  int r;
  int ret;
  shar *shar;
  char *u;
  char *p;
  char *g;
  archive_write *a_local;
  
  shar_00 = (shar *)a->format_data;
  if (shar_00->entry == (archive_entry *)0x0) {
    a_local._4_4_ = 0;
  }
  else {
    if (shar_00->dump == 0) {
      if (shar_00->has_data != 0) {
        if (shar_00->end_of_line == 0) {
          archive_strappend_char(&shar_00->work,'\n');
        }
        archive_strcat(&shar_00->work,"SHAR_END\n");
      }
    }
    else {
      if (shar_00->has_data != 0) {
        if ((shar_00->outpos != 0) &&
           (iVar1 = _uuencode_line(a,shar_00,shar_00->outbuff,shar_00->outpos), iVar1 != 0)) {
          return -0x1e;
        }
        archive_strcat(&shar_00->work,"`\nend\n");
        archive_strcat(&shar_00->work,"SHAR_END\n");
      }
      mVar2 = archive_entry_mode(shar_00->entry);
      archive_string_sprintf(&shar_00->work,"chmod %o ",(ulong)(mVar2 & 0xfff));
      pcVar3 = archive_entry_pathname(shar_00->entry);
      shar_quote(&shar_00->work,pcVar3,1);
      archive_strcat(&shar_00->work,"\n");
      pcVar3 = archive_entry_uname(shar_00->entry);
      str = archive_entry_gname(shar_00->entry);
      if ((pcVar3 != (char *)0x0) || (str != (char *)0x0)) {
        archive_strcat(&shar_00->work,"chown ");
        if (pcVar3 != (char *)0x0) {
          shar_quote(&shar_00->work,pcVar3,1);
        }
        if (str != (char *)0x0) {
          archive_strcat(&shar_00->work,":");
          shar_quote(&shar_00->work,str,1);
        }
        archive_strcat(&shar_00->work," ");
        pcVar3 = archive_entry_pathname(shar_00->entry);
        shar_quote(&shar_00->work,pcVar3,1);
        archive_strcat(&shar_00->work,"\n");
      }
      pcVar3 = archive_entry_fflags_text(shar_00->entry);
      if (pcVar3 != (char *)0x0) {
        archive_string_sprintf(&shar_00->work,"chflags %s ",pcVar3);
        pcVar3 = archive_entry_pathname(shar_00->entry);
        shar_quote(&shar_00->work,pcVar3,1);
        archive_strcat(&shar_00->work,"\n");
      }
    }
    archive_entry_free(shar_00->entry);
    shar_00->entry = (archive_entry *)0x0;
    if ((shar_00->work).length < 0x10000) {
      a_local._4_4_ = 0;
    }
    else {
      iVar1 = __archive_write_output(a,(shar_00->work).s,(shar_00->work).length);
      if (iVar1 == 0) {
        (shar_00->work).length = 0;
        a_local._4_4_ = 0;
      }
      else {
        a_local._4_4_ = -0x1e;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_shar_finish_entry(struct archive_write *a)
{
	const char *g, *p, *u;
	struct shar *shar;
	int ret;

	shar = (struct shar *)a->format_data;
	if (shar->entry == NULL)
		return (0);

	if (shar->dump) {
		/* Finish uuencoded data. */
		if (shar->has_data) {
			if (shar->outpos > 0)
				uuencode_line(a, shar, shar->outbuff,
				    shar->outpos);
			archive_strcat(&shar->work, "`\nend\n");
			archive_strcat(&shar->work, "SHAR_END\n");
		}
		/* Restore file mode, owner, flags. */
		/*
		 * TODO: Don't immediately restore mode for
		 * directories; defer that to end of script.
		 */
		archive_string_sprintf(&shar->work, "chmod %o ",
		    (unsigned int)(archive_entry_mode(shar->entry) & 07777));
		shar_quote(&shar->work, archive_entry_pathname(shar->entry), 1);
		archive_strcat(&shar->work, "\n");

		u = archive_entry_uname(shar->entry);
		g = archive_entry_gname(shar->entry);
		if (u != NULL || g != NULL) {
			archive_strcat(&shar->work, "chown ");
			if (u != NULL)
				shar_quote(&shar->work, u, 1);
			if (g != NULL) {
				archive_strcat(&shar->work, ":");
				shar_quote(&shar->work, g, 1);
			}
			archive_strcat(&shar->work, " ");
			shar_quote(&shar->work,
			    archive_entry_pathname(shar->entry), 1);
			archive_strcat(&shar->work, "\n");
		}

		if ((p = archive_entry_fflags_text(shar->entry)) != NULL) {
			archive_string_sprintf(&shar->work, "chflags %s ", p);
			shar_quote(&shar->work,
			    archive_entry_pathname(shar->entry), 1);
			archive_strcat(&shar->work, "\n");
		}

		/* TODO: restore ACLs */

	} else {
		if (shar->has_data) {
			/* Finish sed-encoded data:  ensure last line ends. */
			if (!shar->end_of_line)
				archive_strappend_char(&shar->work, '\n');
			archive_strcat(&shar->work, "SHAR_END\n");
		}
	}

	archive_entry_free(shar->entry);
	shar->entry = NULL;

	if (shar->work.length < 65536)
		return (ARCHIVE_OK);

	ret = __archive_write_output(a, shar->work.s, shar->work.length);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	archive_string_empty(&shar->work);

	return (ARCHIVE_OK);
}